

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

uint XXH32_intermediateDigest(void *state_in)

{
  uint uVar1;
  ulong *puVar2;
  ulong *in_RDI;
  XXH_endianess endian_detected;
  U32 h32_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  XXH_state32_t *state_1;
  U32 h32;
  BYTE *bEnd;
  BYTE *p;
  XXH_state32_t *state;
  uint local_74;
  ulong *local_68;
  
  local_68 = in_RDI + 4;
  puVar2 = (ulong *)((long)in_RDI + (long)*(int *)((long)in_RDI + 0x1c) + 0x20);
  if (*in_RDI < 0x10) {
    local_74 = (int)in_RDI[1] + 0x165667b1;
  }
  else {
    local_74 = (*(int *)((long)in_RDI + 0xc) << 1 | *(uint *)((long)in_RDI + 0xc) >> 0x1f) +
               ((int)in_RDI[2] << 7 | (uint)in_RDI[2] >> 0x19) +
               (*(int *)((long)in_RDI + 0x14) << 0xc | *(uint *)((long)in_RDI + 0x14) >> 0x14) +
               ((int)in_RDI[3] << 0x12 | (uint)in_RDI[3] >> 0xe);
  }
  local_74 = (int)*in_RDI + local_74;
  for (; local_68 <= (ulong *)((long)puVar2 + -4); local_68 = (ulong *)((long)local_68 + 4)) {
    local_74 = (int)*local_68 * -0x3d4d51c3 + local_74;
    local_74 = (local_74 * 0x20000 | local_74 >> 0xf) * 0x27d4eb2f;
  }
  for (; local_68 < puVar2; local_68 = (ulong *)((long)local_68 + 1)) {
    local_74 = (uint)(byte)*local_68 * 0x165667b1 + local_74;
    local_74 = (local_74 * 0x800 | local_74 >> 0x15) * -0x61c8864f;
  }
  uVar1 = (local_74 >> 0xf ^ local_74) * -0x7a143589;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51c3;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

U32 XXH32_intermediateDigest (void* state_in)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;
    
    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_intermediateDigest_endian(state_in, XXH_littleEndian);
    else
        return XXH32_intermediateDigest_endian(state_in, XXH_bigEndian);
}